

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O3

void mkcavepos(xchar x,xchar y,int dist,boolean waslit,boolean rockit)

{
  char cVar1;
  uint uVar2;
  monst *mtmp;
  level *plVar3;
  uint uVar4;
  trap *ptVar5;
  uint uVar6;
  int y_00;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  int x_00;
  schar sVar7;
  char local_44;
  
  plVar3 = level;
  if (0x14 < (byte)y || 0x4e < (byte)(x - 1U)) {
    return;
  }
  cVar1 = level->locations[(byte)x][(byte)y].typ;
  y_00 = (int)CONCAT71(in_register_00000031,y);
  x_00 = (int)CONCAT71(in_register_00000039,x);
  if (waslit == '\0') {
    if (cVar1 == '\x19') {
      return;
    }
    uVar6 = 0x400;
    uVar4 = 0x800;
    sVar7 = '\x19';
  }
  else {
    if (cVar1 < '\x11') {
      return;
    }
    ptVar5 = t_at(level,x_00,y_00);
    if (ptVar5 != (trap *)0x0) {
      return;
    }
    mtmp = level->monsters[(byte)x][(byte)y];
    sVar7 = '\0';
    if (mtmp == (monst *)0x0) {
LAB_00167a90:
      sVar7 = '\0';
      uVar4 = 0;
      uVar6 = 0;
    }
    else {
      uVar4 = 0;
      uVar6 = 0;
      if ((mtmp->field_0x61 & 2) == 0) {
        sVar7 = '\0';
        uVar4 = 0;
        if ((mtmp->data->mflags1 & 8) == 0) {
          rloc(level,mtmp,'\0');
          goto LAB_00167a90;
        }
      }
    }
  }
  unblock_point(x_00,y_00);
  plVar3->locations[(byte)x][(byte)y].seenv = '\0';
  uVar2 = *(uint *)&plVar3->locations[(byte)x][(byte)y].field_0x6;
  local_44 = (char)dist;
  uVar4 = uVar2 & 0xfffff00f | uVar6 | uVar4;
  if (local_44 == '\0') {
    uVar4 = uVar2 & 0xfffffa0f | uVar6;
  }
  *(uint *)&plVar3->locations[(byte)x][(byte)y].field_0x6 = uVar4 & 0xfffffc0f;
  viz_array[(byte)y][(byte)x] = '\x03';
  plVar3->locations[(byte)x][(byte)y].typ = sVar7;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_00167b88;
      goto LAB_00167b45;
    }
  }
  else {
LAB_00167b45:
    if (ublindf == (obj *)0x0) goto LAB_00167b50;
  }
  if (ublindf->oartifact == '\x1d') {
LAB_00167b88:
    newsym(x_00,y_00);
    return;
  }
LAB_00167b50:
  feel_location(x,y);
  return;
}

Assistant:

static void mkcavepos(xchar x, xchar y, int dist, boolean waslit, boolean rockit)
{
    struct rm *loc;

    if (!isok(x,y)) return;
    loc = &level->locations[x][y];

    if (rockit) {
	struct monst *mtmp;

	if (IS_ROCK(loc->typ)) return;
	if (t_at(level, x, y)) return; /* don't cover the portal */
	if ((mtmp = m_at(level, x, y)) != 0)	/* make sure crucial monsters survive */
	    if (!passes_walls(mtmp->data)) rloc(level, mtmp, FALSE);
    } else if (loc->typ == ROOM) return;

    unblock_point(x,y);	/* make sure vision knows this location is open */

    /* fake out saved state */
    loc->seenv = 0;
    loc->doormask = 0;
    if (dist < 3) loc->lit = (rockit ? FALSE : TRUE);
    if (waslit) loc->waslit = (rockit ? FALSE : TRUE);
    loc->horizontal = FALSE;
    viz_array[y][x] = (dist < 3 ) ?
	(IN_SIGHT|COULD_SEE) : /* short-circuit vision recalc */
	COULD_SEE;
    loc->typ = (rockit ? STONE : ROOM);
    if (dist >= 3)
	impossible("mkcavepos called with dist %d", dist);
    if (Blind)
	feel_location(x, y);
    else newsym(x,y);
}